

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kss_Scc_Apu.cpp
# Opt level: O0

void __thiscall Scc_Apu::run_until(Scc_Apu *this,blip_time_t end_time)

{
  char cVar1;
  char cVar2;
  Blip_Buffer *this_00;
  int iVar3;
  imp_t *piVar4;
  long lVar5;
  uint uVar6;
  int in_ESI;
  Blip_Synth<8,_1> *in_RDI;
  int delta_1;
  int amp_1;
  int last_wave;
  int phase;
  blargg_long count;
  blip_time_t time;
  int delta;
  int amp;
  int8_t *wave;
  blip_time_t inaudible_period;
  int volume;
  blip_time_t period;
  Blip_Buffer *output;
  osc_t *osc;
  int index;
  int in_stack_ffffffffffffff98;
  blip_time_t in_stack_ffffffffffffff9c;
  uint local_4c;
  int local_44;
  long local_38;
  int local_28;
  int local_10;
  
  for (local_10 = 0; local_10 < 5; local_10 = local_10 + 1) {
    piVar4 = in_RDI->impulses + (long)local_10 * 0xc + -0x14;
    this_00 = *(Blip_Buffer **)(piVar4 + 8);
    if (this_00 != (Blip_Buffer *)0x0) {
      Blip_Buffer::set_modified(this_00);
      uVar6 = (*(byte *)((long)in_RDI->impulses + (long)(local_10 * 2 + 0x81) + 0x54) & 0xf) * 0x100
              + (uint)*(byte *)((long)in_RDI->impulses + (long)(local_10 * 2 + 0x80) + 0x54) + 1;
      local_28 = 0;
      if ((((uint)*(byte *)((long)in_RDI->impulses + 0xe3) & 1 << ((byte)local_10 & 0x1f)) != 0) &&
         (lVar5 = Blip_Buffer::clock_rate(this_00), (int)lVar5 + 0x80000U >> 0x12 < uVar6)) {
        local_28 = (*(byte *)((long)in_RDI->impulses + (long)(local_10 + 0x8a) + 0x54) & 0xf) << 3;
      }
      local_38 = (long)in_RDI->impulses + (long)(local_10 << 5) + 0x54;
      if (local_10 == 4) {
        local_38 = local_38 + -0x20;
      }
      iVar3 = *(char *)(local_38 + *(int *)(piVar4 + 2)) * local_28;
      if (iVar3 - *(int *)(piVar4 + 4) != 0) {
        *(int *)(piVar4 + 4) = iVar3;
        Blip_Synth<8,_1>::offset
                  (in_RDI,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98,
                   (Blip_Buffer *)0x95e359);
      }
      local_44 = *(int *)(in_RDI->impulses + 0x28) + *(int *)piVar4;
      if (local_44 < in_ESI) {
        if (local_28 == 0) {
          iVar3 = (int)((in_ESI - local_44) + uVar6 + -1) / (int)uVar6;
          *(uint *)(piVar4 + 2) = *(int *)(piVar4 + 2) + iVar3 & 0x1f;
          local_44 = iVar3 * uVar6 + local_44;
        }
        else {
          cVar1 = *(char *)(local_38 + *(int *)(piVar4 + 2));
          local_4c = *(int *)(piVar4 + 2) + 1U & 0x1f;
          do {
            cVar2 = *(char *)(local_38 + (int)local_4c);
            local_4c = local_4c + 1 & 0x1f;
            if (cVar2 != cVar1) {
              Blip_Synth<8,_1>::offset
                        (in_RDI,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98,
                         (Blip_Buffer *)0x95e450);
              cVar1 = cVar2;
            }
            local_44 = uVar6 + local_44;
          } while (local_44 < in_ESI);
          uVar6 = local_4c - 1 & 0x1f;
          *(uint *)(piVar4 + 2) = uVar6;
          *(int *)(piVar4 + 4) = *(char *)(local_38 + (int)uVar6) * local_28;
        }
      }
      *(int *)piVar4 = local_44 - in_ESI;
    }
  }
  *(int *)(in_RDI->impulses + 0x28) = in_ESI;
  return;
}

Assistant:

void Scc_Apu::run_until( blip_time_t end_time )
{
	for ( int index = 0; index < osc_count; index++ )
	{
		osc_t& osc = oscs [index];
		
		Blip_Buffer* const output = osc.output;
		if ( !output )
			continue;
		output->set_modified();
		
		blip_time_t period = (regs [0x80 + index * 2 + 1] & 0x0F) * 0x100 +
				regs [0x80 + index * 2] + 1;
		int volume = 0;
		if ( regs [0x8F] & (1 << index) )
		{
			blip_time_t inaudible_period = (blargg_ulong) (output->clock_rate() +
					inaudible_freq * 32) / (inaudible_freq * 16);
			if ( period > inaudible_period )
				volume = (regs [0x8A + index] & 0x0F) * (amp_range / 256 / 15);
		}
		
		BOOST::int8_t const* wave = (BOOST::int8_t*) regs + index * wave_size;
		if ( index == osc_count - 1 )
			wave -= wave_size; // last two oscs share wave
		{
			int amp = wave [osc.phase] * volume;
			int delta = amp - osc.last_amp;
			if ( delta )
			{
				osc.last_amp = amp;
				synth.offset( last_time, delta, output );
			}
		}
		
		blip_time_t time = last_time + osc.delay;
		if ( time < end_time )
		{
			if ( !volume )
			{
				// maintain phase
				blargg_long count = (end_time - time + period - 1) / period;
				osc.phase = (osc.phase + count) & (wave_size - 1);
				time += count * period;
			}
			else
			{
				
				int phase = osc.phase;
				int last_wave = wave [phase];
				phase = (phase + 1) & (wave_size - 1); // pre-advance for optimal inner loop
				
				do
				{
					int amp = wave [phase];
					phase = (phase + 1) & (wave_size - 1);
					int delta = amp - last_wave;
					if ( delta )
					{
						last_wave = amp;
						synth.offset( time, delta * volume, output );
					}
					time += period;
				}
				while ( time < end_time );
				
				osc.phase = phase = (phase - 1) & (wave_size - 1); // undo pre-advance
				osc.last_amp = wave [phase] * volume;
			}
		}
		osc.delay = time - end_time;
	}
	last_time = end_time;
}